

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrominoTypeFactory.cpp
# Opt level: O3

TetrominoType * __thiscall TetrominoTypeFactory::initL(TetrominoTypeFactory *this)

{
  Vec2d *this_00;
  Vec2d *this_01;
  Vec2d *this_02;
  Vec2d *this_03;
  Vec2d *this_04;
  TetrominoType *pTVar1;
  
  this_00 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_00,0.0,2.0);
  this_01 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_01,0.0,1.0);
  this_02 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_02,0.0,0.0);
  this_03 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_03,1.0,0.0);
  this_04 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_04,1.0,1.0);
  pTVar1 = initTetrominoType(this,'L',this_00,this_01,this_02,this_03,this_04,6,false,0);
  return pTVar1;
}

Assistant:

TetrominoType* TetrominoTypeFactory::initL() {
    return initTetrominoType(  'L'
                             
                             , new Vec2d(0, 2)
                             , new Vec2d(0, 1)
                             , new Vec2d(0, 0), new Vec2d(1, 0)
                             
                             , new Vec2d(1, 1)
                             , Palette::YELLOW
                             , 0
    );
}